

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smc.cpp
# Opt level: O3

void __thiscall SMC::init_REDCELL(SMC *this,Params *params)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Residue *pRVar4;
  Atom *pAVar5;
  Atom *pAVar6;
  int iVar7;
  int iVar8;
  pointer piVar9;
  ulong uVar10;
  long lVar11;
  iterator __position;
  long lVar12;
  double dVar13;
  double dVar14;
  double dVar16;
  double dVar17;
  undefined1 auVar15 [16];
  double dVar18;
  double dVar19;
  vector<double,_std::allocator<double>_> EllipConst2A;
  double local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  piVar9 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar9) {
    uVar10 = 0;
    do {
      local_50 = Ellipsoid_Detect(&this->Conf,piVar9[uVar10],
                                  (params->ends).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar10],true);
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_48,
                   (iterator)
                   local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_50);
      }
      else {
        *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_50;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      uVar10 = uVar10 + 1;
      piVar9 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(params->starts).super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2));
  }
  piVar9 = (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar9) {
    (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar9;
  }
  local_50 = (double)CONCAT44(local_50._4_4_,1);
  if (0 < (this->Conf)._numRes) {
    iVar8 = 1;
    do {
      pRVar4 = (this->Conf)._res;
      dVar1 = pRVar4[iVar8]._center.super_Point.x;
      dVar2 = pRVar4[iVar8]._center.super_Point.y;
      dVar3 = pRVar4[iVar8]._center.super_Point.z;
      if ((((dVar1 != 0.0) || (NAN(dVar1))) || (dVar2 != 0.0)) ||
         (((NAN(dVar2) || (dVar3 != 0.0)) || (NAN(dVar3))))) {
        piVar9 = (params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar11 = (long)(params->starts).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)piVar9;
        if (lVar11 != 0) {
          lVar11 = lVar11 >> 2;
          lVar12 = 0;
          do {
            pAVar5 = pRVar4[piVar9[lVar12]]._atom;
            pAVar6 = pRVar4[(params->ends).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar12]]._atom;
            dVar18 = dVar1 - pAVar5[1].super_Point.x;
            dVar19 = dVar1 - pAVar6[2].super_Point.x;
            dVar13 = dVar2 - pAVar5[1].super_Point.y;
            dVar16 = dVar2 - pAVar6[2].super_Point.y;
            dVar14 = dVar3 - pAVar5[1].super_Point.z;
            dVar17 = dVar3 - pAVar6[2].super_Point.z;
            auVar15._0_8_ = dVar14 * dVar14 + dVar18 * dVar18 + dVar13 * dVar13;
            auVar15._8_8_ = dVar17 * dVar17 + dVar19 * dVar19 + dVar16 * dVar16;
            auVar15 = sqrtpd(auVar15,auVar15);
            if (auVar15._8_8_ + auVar15._0_8_ <
                local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar12] + Residue::size[pRVar4[iVar8]._type] + 5.5)
            {
              __position._M_current =
                   (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (__position._M_current !=
                  (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_001353e4;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&this->Reslist,__position,
                         (int *)&local_50);
              break;
            }
            lVar12 = lVar12 + 1;
          } while (lVar11 + (ulong)(lVar11 == 0) != lVar12);
        }
      }
      else {
        __position._M_current =
             (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->Reslist,__position,(int *)&local_50);
        }
        else {
LAB_001353e4:
          *__position._M_current = iVar8;
          (this->Reslist).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      iVar7 = local_50._0_4_;
      iVar8 = local_50._0_4_ + 1;
      local_50 = (double)CONCAT44(local_50._4_4_,iVar8);
    } while (iVar7 < (this->Conf)._numRes);
  }
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SMC::init_REDCELL(const struct Params &params) {
    // calculate Ellipsoid constant 2a
    vector<double> EllipConst2A;
    for (int j = 0; j < params.starts.size(); j++)
        EllipConst2A.push_back(Ellipsoid_Detect(this->Conf, params.starts[j], params.ends[j], true));

    this->Reslist.clear();
    // test the space after using ellipsoid and surface
    for (int i = 1; i <= this->Conf._numRes; i++) {
        // Assuming this residue is part of simulated loop region, always include it!
        if (this->Conf._res[i]._center.is_at_origin()) {
            this->Reslist.push_back(i);
            continue;
        }

        for (int j = 0; j < params.starts.size(); j++) {
            const double dis = this->Conf._res[i]._center.dis(this->Conf._res[params.starts[j]]._atom[ATM_CA]) +
                               this->Conf._res[i]._center.dis(this->Conf._res[params.ends[j]]._atom[ATM_C]);
            if (dis < EllipConst2A[j] + Residue::size[this->Conf._res[i]._type] + CUB_SIZE) {
                this->Reslist.push_back(i);
                break;
            }
        }
    }
}